

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cdr.cpp
# Opt level: O3

Cdr * __thiscall
eprosima::fastcdr::Cdr::deserializeArray
          (Cdr *this,wchar_t *wchar,size_t numElements,Endianness endianness)

{
  bool bVar1;
  undefined8 in_RAX;
  size_t sVar2;
  uint32_t value;
  undefined8 uStack_38;
  
  bVar1 = this->m_swapBytes;
  this->m_swapBytes = (bool)(this->m_endianness != endianness ^ bVar1);
  if (numElements != 0) {
    sVar2 = 0;
    uStack_38 = in_RAX;
    do {
      deserialize(this,(int32_t *)((long)&uStack_38 + 4));
      wchar[sVar2] = uStack_38._4_4_;
      sVar2 = sVar2 + 1;
    } while (numElements != sVar2);
  }
  this->m_swapBytes = bVar1;
  return this;
}

Assistant:

Cdr& Cdr::deserializeArray(wchar_t *wchar, size_t numElements, Endianness endianness)
{
    bool auxSwap = m_swapBytes;
    m_swapBytes = (m_swapBytes && (m_endianness == endianness)) || (!m_swapBytes && (m_endianness != endianness));

    try
    {
        deserializeArray(wchar, numElements);
        m_swapBytes = auxSwap;
    }
    catch(Exception &ex)
    {
        m_swapBytes = auxSwap;
        ex.raise();
    }

    return *this;
}